

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.cpp
# Opt level: O0

BOOL __thiscall
Js::ActivationObject::InitFuncScoped(ActivationObject *this,PropertyId propertyId,Var value)

{
  int iVar1;
  DynamicTypeHandler *pDVar2;
  byte local_21;
  Var pvStack_20;
  bool noRedecl;
  Var value_local;
  ActivationObject *pAStack_10;
  PropertyId propertyId_local;
  ActivationObject *this_local;
  
  local_21 = 0;
  pvStack_20 = value;
  value_local._4_4_ = propertyId;
  pAStack_10 = this;
  pDVar2 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  iVar1 = (*pDVar2->_vptr_DynamicTypeHandler[0x11])
                    (pDVar2,this,(ulong)value_local._4_4_,&local_21,0);
  if ((iVar1 == 0) || ((local_21 & 1) == 0)) {
    DynamicObject::InitProperty
              (&this->super_DynamicObject,value_local._4_4_,pvStack_20,
               PropertyOperation_NonFixedValue,(PropertyValueInfo *)0x0);
  }
  return 1;
}

Assistant:

BOOL ActivationObject::InitFuncScoped(PropertyId propertyId, Var value)
    {
        // Var binding of functions declared in eval are elided when conflicting
        // with function scope let/const variables, so do not actually set the
        // property if it exists and is a let/const variable.
        bool noRedecl = false;
        if (!GetTypeHandler()->HasProperty(this, propertyId, &noRedecl) || !noRedecl)
        {
            DynamicObject::InitProperty(propertyId, value, PropertyOperation_NonFixedValue);
        }
        return true;
    }